

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void * malloc_base(void *context,size_t size,stb__alloc_type t,int align)

{
  int iVar1;
  uint uVar2;
  stb__alloc_type sVar3;
  stb__nochildren *s;
  stb__alloc *s_00;
  stb__alloc *psVar4;
  undefined8 *puVar5;
  stb__alloc *src;
  uint n;
  uint align_00;
  
  if (context == (void *)0x0) {
    src = &stb__alloc_global;
  }
  else if (((uint)*(long *)((long)context + -8) & 3) == 1) {
    src = (stb__alloc *)(*(long *)((long)context + -8) + -1);
  }
  else {
    src = (stb__alloc *)((long)context + -0x20);
  }
  n = (uint)size;
  align_00 = align;
  if (align < 1) {
    iVar1 = stb_lowbit8(n);
    uVar2 = 4;
    if (iVar1 != 0x1f) {
      uVar2 = 1 << ((byte)iVar1 & 0x1f);
    }
    align_00 = uVar2;
    if ((align < 0) && (align_00 = -align, SBORROW4(uVar2,-align) != (int)(uVar2 + align) < 0)) {
      align_00 = uVar2;
    }
  }
  if ((align_00 & align_00 - 1) == 0) {
    sVar3 = STB__alloc;
    if ((int)align_00 < 9) {
      sVar3 = t;
    }
    if (t != STB__nochildren) {
      sVar3 = t;
    }
    switch(sVar3) {
    case STB__nochildren:
      s = (stb__nochildren *)malloc(size + 0x10);
      if (s == (stb__nochildren *)0x0) {
        return (void *)0x0;
      }
      psVar4 = (stb__alloc *)(s + 1);
      stb__insert_nochild(src,s);
      break;
    case STB__chunked:
      if (align_00 < 9) {
        align_00 = 8;
      }
      puVar5 = (undefined8 *)stb__alloc_chunk(src,n,align_00,8);
      if (puVar5 == (undefined8 *)0x0) {
        return (void *)0x0;
      }
      *puVar5 = (undefined1 *)((long)&src->prevn + 1);
      psVar4 = (stb__alloc *)(puVar5 + 1);
      break;
    case STB__alloc:
      s_00 = (stb__alloc *)malloc(size + 0x20);
      if (s_00 == (stb__alloc *)0x0) {
        return (void *)0x0;
      }
      psVar4 = s_00 + 1;
      s_00->child = (void *)0x0;
      stb__insert_alloc(src,s_00);
      s_00->chunks = (stb__chunk *)&DAT_00000002;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0xb2b,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
    case STB__chunk_raw:
      psVar4 = (stb__alloc *)stb__alloc_chunk(src,n,align_00,0);
      if (psVar4 == (stb__alloc *)0x0) {
        return (void *)0x0;
      }
    }
    stb_alloc_count_alloc = stb_alloc_count_alloc + 1;
    return psVar4;
  }
  __assert_fail("stb_is_pow2(align)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0xb01,"void *malloc_base(void *, size_t, stb__alloc_type, int)");
}

Assistant:

static void * malloc_base(void *context, size_t size, stb__alloc_type t, int align)
{
   void *p;

   stb__alloc *src = stb__get_context(context);

   if (align <= 0) {
      // compute worst-case C packed alignment
      // e.g. a 24-byte struct is 8-aligned
      int align_proposed = 1 << stb_lowbit8(size);

      if (align_proposed < 0)
         align_proposed = 4;

      if (align_proposed == 0) {
         if (size == 0)
            align_proposed = 1;
         else
            align_proposed = 256;
      }

      // a negative alignment means 'don't align any larger
      // than this'; so -16 means we align 1,2,4,8, or 16

      if (align < 0) {
         if (align_proposed > -align)
            align_proposed = -align;
      }

      align = align_proposed;
   }

   assert(stb_is_pow2(align));

   // don't cause misalignment when allocating nochildren
   if (t == STB__nochildren && align > 8)
      t = STB__alloc;

   switch (t) {
      case STB__alloc: {
         stb__alloc *s = (stb__alloc *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         s->child = NULL;
         stb__insert_alloc(src, s);

         stb__setchunks(s,NULL);
         break;
      }

      case STB__nochildren: {
         stb__nochildren *s = (stb__nochildren *) malloc(size + sizeof(*s));
         if (s == NULL) return NULL;
         p = s+1;
         stb__insert_nochild(src, s);
         break;
      }

      case STB__chunk_raw: {
         p = stb__alloc_chunk(src, size, align, 0);
         if (p == NULL) return NULL;
         break;
      }

      case STB__chunked: {
         stb__chunked *s;
         if (align < sizeof(stb_uintptr)) align = sizeof(stb_uintptr);
         s = (stb__chunked *) stb__alloc_chunk(src, size, align, sizeof(*s));
         if (s == NULL) return NULL;
         stb__setparent(s, src);
         p = s+1;
         break;
      }

      default: p = NULL; assert(0); /* NOTREACHED */
   }

   ++stb_alloc_count_alloc;
   return p;
}